

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_add_clip(nk_draw_list *list,nk_rect rect)

{
  nk_draw_command *pnVar1;
  long in_RDI;
  nk_draw_list *in_XMM0_Qa;
  nk_handle in_XMM1_Qa;
  nk_draw_command *prev;
  nk_rect in_stack_00000000;
  
  if (in_RDI != 0) {
    if (*(int *)(in_RDI + 0xd0) == 0) {
      nk_draw_list_push_command(in_XMM0_Qa,in_stack_00000000,in_XMM1_Qa);
    }
    else {
      pnVar1 = nk_draw_list_command_last(in_XMM0_Qa);
      if (pnVar1->elem_count == 0) {
        *(nk_draw_list **)&pnVar1->clip_rect = in_XMM0_Qa;
        *(nk_handle *)&(pnVar1->clip_rect).w = in_XMM1_Qa;
      }
      nk_draw_list_push_command(in_XMM0_Qa,in_stack_00000000,in_XMM1_Qa);
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_draw_list_add_clip(struct nk_draw_list *list, struct nk_rect rect)
{
NK_ASSERT(list);
if (!list) return;
if (!list->cmd_count) {
nk_draw_list_push_command(list, rect, list->config.null.texture);
} else {
struct nk_draw_command *prev = nk_draw_list_command_last(list);
if (prev->elem_count == 0)
prev->clip_rect = rect;
nk_draw_list_push_command(list, rect, prev->texture);
}
}